

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O2

void __thiscall
TEST_ScoringTableTest_DealerSelfDrawn_ManganOrMore_Test::
TEST_ScoringTableTest_DealerSelfDrawn_ManganOrMore_Test
          (TEST_ScoringTableTest_DealerSelfDrawn_ManganOrMore_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8 = 0;
  (this->super_TEST_GROUP_CppUTestGroupScoringTableTest).super_Utest._vptr_Utest = (_func_int **)0x0
  ;
  TEST_GROUP_CppUTestGroupScoringTableTest::TEST_GROUP_CppUTestGroupScoringTableTest
            (&this->super_TEST_GROUP_CppUTestGroupScoringTableTest);
  (this->super_TEST_GROUP_CppUTestGroupScoringTableTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_001dd5c8;
  return;
}

Assistant:

TEST(ScoringTableTest, DealerSelfDrawn_ManganOrMore)
{
	CHECK_EQUAL(4000, t.dealerSelfDrawn(3, 70));
	CHECK_EQUAL(4000, t.dealerSelfDrawn(4, 40));
	CHECK_EQUAL(4000, t.dealerSelfDrawn(4, 70));
	CHECK_EQUAL(4000, t.dealerSelfDrawn(5, 0));

	CHECK_EQUAL(6000, t.dealerSelfDrawn(6, 0));
	CHECK_EQUAL(6000, t.dealerSelfDrawn(7, 0));

	CHECK_EQUAL(8000, t.dealerSelfDrawn(8, 0));
	CHECK_EQUAL(8000, t.dealerSelfDrawn(9, 0));
	CHECK_EQUAL(8000, t.dealerSelfDrawn(10, 0));

	CHECK_EQUAL(12000, t.dealerSelfDrawn(11, 0));
	CHECK_EQUAL(12000, t.dealerSelfDrawn(12, 0));

	CHECK_EQUAL(16000, t.dealerSelfDrawn(13, 0));
}